

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionState.h
# Opt level: O1

int __thiscall FIX::SessionState::getNextTargetMsgSeqNum(SessionState *this)

{
  int iVar1;
  int iVar2;
  
  Mutex::lock(&this->m_mutex);
  iVar2 = (*this->m_pStore->_vptr_MessageStore[5])();
  iVar1 = (this->m_mutex).m_count;
  (this->m_mutex).m_count = iVar1 + -1;
  if (iVar1 < 2) {
    (this->m_mutex).m_threadID = 0;
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
  }
  return iVar2;
}

Assistant:

int getNextTargetMsgSeqNum() const EXCEPT ( IOException )
  { Locker l( m_mutex ); return m_pStore->getNextTargetMsgSeqNum(); }